

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O0

void math::internal::matrix_householder_vector<double>
               (double *input,int length,double *vector,double *beta,double *epsilon,
               double *norm_factor)

{
  double dVar1;
  double dVar2;
  int local_5c;
  int i_2;
  double mu;
  double first;
  int i_1;
  int i;
  double sigma;
  double *norm_factor_local;
  double *epsilon_local;
  double *beta_local;
  double *vector_local;
  int length_local;
  double *input_local;
  
  _i_1 = 0.0;
  for (first._4_4_ = 1; first._4_4_ < length; first._4_4_ = first._4_4_ + 1) {
    _i_1 = (input[first._4_4_] / *norm_factor) * (input[first._4_4_] / *norm_factor) + _i_1;
  }
  *vector = 1.0;
  for (first._0_4_ = 1; first._0_4_ < length; first._0_4_ = first._0_4_ + 1) {
    vector[first._0_4_] = input[first._0_4_] / *norm_factor;
  }
  if ((_i_1 < 0.0 - *epsilon) || (*epsilon + 0.0 < _i_1)) {
    dVar1 = *input / *norm_factor;
    dVar2 = sqrt(dVar1 * dVar1 + _i_1);
    if (*epsilon <= dVar1) {
      *vector = -_i_1 / (dVar1 + dVar2);
    }
    else {
      *vector = dVar1 - dVar2;
    }
    dVar1 = *vector;
    *beta = (dVar1 * dVar1 * 2.0) / (dVar1 * dVar1 + _i_1);
    for (local_5c = 0; local_5c < length; local_5c = local_5c + 1) {
      vector[local_5c] = vector[local_5c] / dVar1;
    }
  }
  else {
    *beta = 0.0;
  }
  return;
}

Assistant:

void
matrix_householder_vector (T const* input, int length,
    T* vector, T* beta, T const& epsilon, T const& norm_factor)
{
    T sigma(0);
    for (int i = 1; i < length; ++i)
        sigma += MATH_POW2(input[i] / norm_factor);

    vector[0] = T(1);
    for (int i = 1; i < length; ++i)
        vector[i] = input[i] / norm_factor;

    if (MATH_EPSILON_EQ(sigma, T(0), epsilon))
    {
        *beta = T(0);
        return;
    }

    T first = input[0] / norm_factor;
    T mu = std::sqrt(MATH_POW2(first) + sigma);
    if (first < epsilon)
        vector[0] = first - mu;
    else
        vector[0] = -sigma / (first + mu);

    first = vector[0];
    *beta = T(2) * MATH_POW2(first) / (sigma + MATH_POW2(first));
    for (int i = 0; i < length; ++i)
        vector[i] /= first;
}